

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::ImportMixin<(wabt::ExternalKind)4>::ImportMixin(ImportMixin<(wabt::ExternalKind)4> *this)

{
  (this->super_Import).module_name._M_dataplus._M_p =
       (pointer)&(this->super_Import).module_name.field_2;
  (this->super_Import).module_name._M_string_length = 0;
  (this->super_Import).module_name.field_2._M_local_buf[0] = '\0';
  (this->super_Import).field_name._M_dataplus._M_p =
       (pointer)&(this->super_Import).field_name.field_2;
  (this->super_Import).field_name._M_string_length = 0;
  (this->super_Import).field_name.field_2._M_local_buf[0] = '\0';
  (this->super_Import).kind_ = Except;
  (this->super_Import)._vptr_Import = (_func_int **)&PTR__Import_013e1708;
  return;
}

Assistant:

ImportMixin() : Import(TypeEnum) {}